

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

void __thiscall MeCab::anon_unknown_0::TaggerImpl::~TaggerImpl(TaggerImpl *this)

{
  scoped_ptr<MeCab::(anonymous_namespace)::ModelImpl> *in_RDI;
  
  in_RDI->_vptr_scoped_ptr = (_func_int **)&PTR_parse_001c5c50;
  std::__cxx11::string::~string((string *)(in_RDI + 4));
  scoped_ptr<MeCab::Lattice>::~scoped_ptr((scoped_ptr<MeCab::Lattice> *)in_RDI);
  scoped_ptr<MeCab::(anonymous_namespace)::ModelImpl>::~scoped_ptr(in_RDI);
  Tagger::~Tagger((Tagger *)in_RDI);
  return;
}

Assistant:

TaggerImpl::~TaggerImpl() {}